

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void size_class(sc_t *sc,int lg_max_lookup,int lg_page,int lg_ngroup,int index,int lg_base,
               int lg_delta,int ndelta)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  sc->index = lg_max_lookup;
  sc->lg_base = lg_page;
  sc->lg_delta = lg_ngroup;
  sc->ndelta = index;
  uVar4 = ((long)index << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lg_page & 0x3f));
  sc->psz = (uVar4 & 0xfff) == 0;
  if (uVar4 < 0x4000) {
    sc->bin = true;
    uVar3 = 0;
    bVar5 = false;
    do {
      uVar3 = uVar3 + 0x1000;
      bVar1 = true;
      if (uVar3 % uVar4 != 0) {
        bVar1 = bVar5;
      }
      bVar5 = bVar1;
    } while (!bVar1);
    iVar2 = (int)(uVar3 >> 0xc);
  }
  else {
    sc->bin = false;
    iVar2 = 0;
  }
  sc->pgs = iVar2;
  iVar2 = 0;
  if (uVar4 < 0x1001) {
    iVar2 = lg_ngroup;
  }
  sc->lg_delta_lookup = iVar2;
  return;
}

Assistant:

static void
size_class(
    /* Output. */
    sc_t *sc,
    /* Configuration decisions. */
    int lg_max_lookup, int lg_page, int lg_ngroup,
    /* Inputs specific to the size class. */
    int index, int lg_base, int lg_delta, int ndelta) {
	sc->index = index;
	sc->lg_base = lg_base;
	sc->lg_delta = lg_delta;
	sc->ndelta = ndelta;
	size_t size = reg_size_compute(lg_base, lg_delta, ndelta);
	sc->psz = (size % (ZU(1) << lg_page) == 0);
	if (index == 0) {
		assert(!sc->psz);
	}
	if (size < (ZU(1) << (lg_page + lg_ngroup))) {
		sc->bin = true;
		sc->pgs = slab_size(lg_page, lg_base, lg_delta, ndelta);
	} else {
		sc->bin = false;
		sc->pgs = 0;
	}
	if (size <= (ZU(1) << lg_max_lookup)) {
		sc->lg_delta_lookup = lg_delta;
	} else {
		sc->lg_delta_lookup = 0;
	}
}